

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveReader::ReadRealOperand
          (CFFPrimitiveReader *this,double *outValue,long *outRealValueFractalEnd)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  EStatusCode EVar6;
  __type_conflict _Var7;
  double local_80;
  int local_5c;
  int i;
  EStatusCode status;
  Byte nibble [2];
  Byte buffer;
  double fractionDecimal;
  bool notDone;
  bool hasNegativePower;
  bool hasPositivePower;
  bool hasFraction;
  double dStack_40;
  bool hasNegative;
  double result;
  double powerPart;
  double fractionPart;
  double integerPart;
  long *outRealValueFractalEnd_local;
  double *outValue_local;
  CFFPrimitiveReader *this_local;
  
  fractionPart = 0.0;
  powerPart = 0.0;
  result = 0.0;
  bVar5 = false;
  bVar3 = false;
  bVar1 = false;
  bVar2 = false;
  bVar4 = true;
  _status = 1.0;
  *outRealValueFractalEnd = 0;
  do {
    EVar6 = ReadByte(this,(Byte *)((long)&i + 3));
    if (EVar6 != eSuccess) break;
    i._1_1_ = (char)((int)(uint)i._3_1_ >> 4);
    i._2_1_ = i._3_1_ & 0xf;
    for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
      switch(*(undefined1 *)((long)&i + (long)local_5c + 1)) {
      case 10:
        bVar3 = true;
        break;
      case 0xb:
        bVar1 = true;
        break;
      case 0xc:
        bVar2 = true;
        break;
      case 0xd:
        break;
      case 0xe:
        bVar5 = true;
        break;
      case 0xf:
        bVar4 = false;
        break;
      default:
        if ((bVar1) || (bVar2)) {
          result = result * 10.0 + (double)*(byte *)((long)&i + (long)local_5c + 1);
        }
        else if (bVar3) {
          powerPart = powerPart * 10.0 + (double)*(byte *)((long)&i + (long)local_5c + 1);
          _status = _status * 10.0;
          *outRealValueFractalEnd = *outRealValueFractalEnd + 1;
        }
        else {
          fractionPart = fractionPart * 10.0 + (double)*(byte *)((long)&i + (long)local_5c + 1);
        }
      }
    }
  } while (bVar4);
  if (EVar6 == eSuccess) {
    dStack_40 = fractionPart + powerPart / _status;
    if ((bVar2) || (bVar1)) {
      if (bVar2) {
        local_80 = -result;
      }
      else {
        local_80 = result;
      }
      _Var7 = std::pow<int,double>(10,local_80);
      dStack_40 = dStack_40 * _Var7;
    }
    if (bVar5) {
      dStack_40 = dStack_40 * -1.0;
    }
    *outValue = dStack_40;
  }
  return EVar6;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadRealOperand(double& outValue,long& outRealValueFractalEnd)
{
	double integerPart = 0;
	double fractionPart = 0;
	double powerPart = 0;
	double result;
	bool hasNegative = false;
	bool hasFraction = false;
	bool hasPositivePower = false;
	bool hasNegativePower = false;
	bool notDone = true;
	double fractionDecimal = 1;
	outRealValueFractalEnd = 0;
	Byte buffer;
	Byte nibble[2];
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = ReadByte(buffer);
		if(status != PDFHummus::eSuccess)
			break;

		nibble[0] = (buffer >> 4) & 0xf;
		nibble[1] = buffer & 0xf;

		for(int i = 0; i <2; ++i)
		{
			switch(nibble[i])
			{
				case 0xa:
					hasFraction = true;
					break;
				case 0xb:
					hasPositivePower = true;
					break;
				case 0xc:
					hasNegativePower = true;
					break;
				case 0xd:
					// reserved
					break;
				case 0xe:
					hasNegative = true;
					break;
				case 0xf:
					notDone = false;
					break;
				default: // numbers
					if(hasPositivePower || hasNegativePower)
					{
						powerPart = powerPart*10 + nibble[i];
					}
					else if(hasFraction)
					{
						fractionPart = fractionPart * 10 + nibble[i];
						fractionDecimal *= 10;
						++outRealValueFractalEnd;
					}
					else
						integerPart = integerPart * 10 + nibble[i];

			}
		}
	}while(notDone);

	if(PDFHummus::eSuccess == status)
	{
		result = integerPart + fractionPart/fractionDecimal;
		if(hasNegativePower || hasPositivePower)
			result = result * pow(10,hasNegativePower ? -powerPart : powerPart);
		if(hasNegative)
			result = -1*result;
		outValue = result;
	}
	return status;
}